

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtVector3.h
# Opt level: O2

long __thiscall
cbtVector3::maxDot(cbtVector3 *this,cbtVector3 *array,long array_count,cbtScalar *dotOut)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  cbtScalar cVar4;
  undefined1 extraout_var [12];
  float fVar5;
  undefined1 auVar6 [64];
  
  auVar6 = ZEXT464(0xff7fffff);
  uVar2 = 0xffffffffffffffff;
  for (uVar3 = 0; fVar5 = auVar6._0_4_, (~(array_count >> 0x3f) & array_count) != uVar3;
      uVar3 = uVar3 + 1) {
    cVar4 = dot(array,this);
    auVar1._4_12_ = extraout_var;
    auVar1._0_4_ = cVar4;
    auVar1 = vmaxss_avx(auVar1,ZEXT416((uint)fVar5));
    auVar6 = ZEXT1664(auVar1);
    if (fVar5 < cVar4) {
      uVar2 = uVar3;
    }
    uVar2 = uVar2 & 0xffffffff;
    array = array + 1;
  }
  *dotOut = fVar5;
  return (long)(int)uVar2;
}

Assistant:

SIMD_FORCE_INLINE long cbtVector3::maxDot(const cbtVector3* array, long array_count, cbtScalar& dotOut) const
{
#if (defined BT_USE_SSE && defined BT_USE_SIMD_VECTOR3 && defined BT_USE_SSE_IN_API) || defined(BT_USE_NEON)
#if defined _WIN32 || defined(BT_USE_SSE)
	const long scalar_cutoff = 10;
	long _maxdot_large(const float* array, const float* vec, unsigned long array_count, float* dotOut);
#elif defined BT_USE_NEON
	const long scalar_cutoff = 4;
	extern long (*_maxdot_large)(const float* array, const float* vec, unsigned long array_count, float* dotOut);
#endif
	if (array_count < scalar_cutoff)
#endif
	{
		cbtScalar maxDot1 = -SIMD_INFINITY;
		int i = 0;
		int ptIndex = -1;
		for (i = 0; i < array_count; i++)
		{
			cbtScalar dot = array[i].dot(*this);

			if (dot > maxDot1)
			{
				maxDot1 = dot;
				ptIndex = i;
			}
		}

		dotOut = maxDot1;
		return ptIndex;
	}
#if (defined BT_USE_SSE && defined BT_USE_SIMD_VECTOR3 && defined BT_USE_SSE_IN_API) || defined(BT_USE_NEON)
	return _maxdot_large((float*)array, (float*)&m_floats[0], array_count, &dotOut);
#endif
}